

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  *this;
  double dVar1;
  double dVar2;
  SaveBlock save;
  LoadBlock load_;
  bool bVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  int iVar6;
  double dVar7;
  undefined4 uStack_1b48;
  bool help;
  undefined4 local_1b44;
  undefined8 local_1b40;
  communicator world;
  QueuePolicy *in_stack_ffffffffffffe4e0;
  __uniq_ptr_impl<opts::BasicOption,_std::default_delete<opts::BasicOption>_> local_1b18;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1b10;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1b08;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1b00;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1af8;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1af0;
  float quantile;
  float sample_frac;
  int max_time;
  int iters;
  int bpr;
  environment env;
  double balance_time;
  double local_1ac0;
  double comp_time;
  double wall_time;
  code *local_1aa8 [2];
  code *local_1a98;
  code *local_1a90;
  _Any_data local_1a88;
  code *local_1a78;
  code *local_1a70;
  double local_1a60;
  string local_1a58;
  ContiguousAssigner static_assigner;
  code *local_1a18 [2];
  code *local_1a08;
  code *local_1a00;
  code *local_19f8 [2];
  code *local_19e8;
  code *local_19e0;
  code *local_19d8 [2];
  code *local_19c8;
  code *local_19c0;
  code *local_19b8 [2];
  code *local_19a8;
  code *local_19a0;
  time_t t;
  communicator local_1978;
  DynamicAssigner dynamic_assigner;
  _Vector_base<int,_std::allocator<int>_> local_1918;
  _Vector_base<int,_std::allocator<int>_> local_18f8;
  string local_18e0;
  string local_18c0;
  string local_18a0;
  Options ops;
  Bounds domain;
  _Bvector_base<std::allocator<bool>_> local_17c8;
  _Bvector_base<std::allocator<bool>_> local_1798;
  RegularDecomposer<diy::Bounds<int>_> decomposer;
  Master master;
  
  diy::mpi::environment::environment(&env,argc,argv);
  diy::mpi::communicator::communicator(&world);
  bpr = 4;
  comp_time = 0.0;
  iVar6 = 1;
  balance_time = 0.0;
  sample_frac = 0.5;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  quantile = 0.8;
  this = &ops.options;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.failed = false;
  max_time = iVar6;
  iters = iVar6;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.args.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&master,"help",(allocator<char> *)((long)&local_1b40 + 7));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&decomposer,"show help",(allocator<char> *)((long)&local_1b40 + 6));
  opts::Option<bool>((opts *)&local_1af0,'h',(string *)&master,&help,(string *)&decomposer);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1af0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&domain,"bpr",(allocator<char> *)((long)&local_1b40 + 5));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dynamic_assigner,"number of diy blocks per mpi rank",
             (allocator<char> *)((long)&local_1b40 + 4));
  opts::Option<int>((opts *)&local_1af8,'b',(string *)&domain,&bpr,(string *)&dynamic_assigner);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1af8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1aa8,"iters",(allocator<char> *)((long)&local_1b40 + 3));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a88._M_pod_data,"number of iterations",
             (allocator<char> *)((long)&local_1b40 + 2));
  opts::Option<int>((opts *)&local_1b00,'i',(string *)local_1aa8,&iters,(string *)&local_1a88);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1b00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&static_assigner,"max_time",(allocator<char> *)((long)&local_1b40 + 1));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&t,"maximum time to compute a block (in seconds)",
             (allocator<char> *)&local_1b40);
  opts::Option<int>((opts *)&local_1b08,'t',(string *)&static_assigner,&max_time,(string *)&t);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1b08);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a58,"sample_frac",(allocator<char> *)((long)&local_1b44 + 3));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_18a0,"fraction of world procs to sample (0.0 - 1.0)",
             (allocator<char> *)((long)&local_1b44 + 2));
  opts::Option<float>((opts *)&local_1b10,'s',&local_1a58,&sample_frac,&local_18a0);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1b10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_18c0,"quantile",(allocator<char> *)((long)&local_1b44 + 1));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_18e0,"quantile cutoff above which to move blocks (0.0 - 1.0)",
             (allocator<char> *)&local_1b44);
  opts::Option<float>((opts *)&local_1b18,'q',&local_18c0,&quantile,&local_18e0);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1b18);
  if (local_1b18._M_t.
      super__Tuple_impl<0UL,_opts::BasicOption_*,_std::default_delete<opts::BasicOption>_>.
      super__Head_base<0UL,_opts::BasicOption_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_opts::BasicOption_*,_std::default_delete<opts::BasicOption>_>)0x0) {
    (**(code **)(*(long *)local_1b18._M_t.
                          super__Tuple_impl<0UL,_opts::BasicOption_*,_std::default_delete<opts::BasicOption>_>
                          .super__Head_base<0UL,_opts::BasicOption_*,_false>._M_head_impl + 8))();
  }
  local_1b18._M_t.
  super__Tuple_impl<0UL,_opts::BasicOption_*,_std::default_delete<opts::BasicOption>_>.
  super__Head_base<0UL,_opts::BasicOption_*,_false>._M_head_impl =
       (tuple<opts::BasicOption_*,_std::default_delete<opts::BasicOption>_>)
       (_Tuple_impl<0UL,_opts::BasicOption_*,_std::default_delete<opts::BasicOption>_>)0x0;
  std::__cxx11::string::~string((string *)&local_18e0);
  std::__cxx11::string::~string((string *)&local_18c0);
  if (local_1b10._M_head_impl != (BasicOption *)0x0) {
    (*(local_1b10._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1b10._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_18a0);
  std::__cxx11::string::~string((string *)&local_1a58);
  if (local_1b08._M_head_impl != (BasicOption *)0x0) {
    (*(local_1b08._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1b08._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::~string((string *)&static_assigner);
  if (local_1b00._M_head_impl != (BasicOption *)0x0) {
    (*(local_1b00._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1b00._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)local_1a88._M_pod_data);
  std::__cxx11::string::~string((string *)local_1aa8);
  if (local_1af8._M_head_impl != (BasicOption *)0x0) {
    (*(local_1af8._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1af8._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&dynamic_assigner);
  std::__cxx11::string::~string((string *)&domain);
  if (local_1af0._M_head_impl != (BasicOption *)0x0) {
    (*(local_1af0._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1af0._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&decomposer);
  std::__cxx11::string::~string((string *)&master);
  bVar3 = opts::Options::parse(&ops,argc,argv);
  if ((bVar3) && (help != true)) {
    iVar6 = bpr * world.size_;
    static_assigner.super_StaticAssigner.super_Assigner.size_ = world.size_;
    static_assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
         (_func_int **)&PTR__Assigner_0014d298;
    static_assigner.super_StaticAssigner.super_Assigner.nblocks_ = iVar6;
    diy::Bounds<int>::Bounds(&domain,3);
    domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[2] = 0;
    domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 0;
    domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 0;
    domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[2] = 0xff;
    domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 0xff;
    domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 0xff;
    if (world.rank_ == 0) {
      t = time((time_t *)0x0);
    }
    diy::mpi::Collectives<long,_void_*>::broadcast(&world,&t,0);
    srand(world.rank_ + (int)t);
    local_1978.comm_.data = world.comm_.data;
    local_1978.owner_ = false;
    local_19b8[1] = (code *)0x0;
    local_19b8[0] = Block::create;
    local_19a0 = std::_Function_handler<void_*(),_void_*(*)()>::_M_invoke;
    local_19a8 = std::_Function_handler<void_*(),_void_*(*)()>::_M_manager;
    local_19d8[1] = (code *)0x0;
    local_19d8[0] = Block::destroy;
    local_19c0 = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
    local_19f8[1] = (code *)0x0;
    local_19c8 = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
    local_19f8[0] = Block::save;
    local_19e0 = std::
                 _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
                 ::_M_invoke;
    local_1a18[1] = (code *)0x0;
    local_19e8 = std::
                 _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
                 ::_M_manager;
    local_1a18[0] = Block::load;
    local_1a00 = std::
                 _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
                 ::_M_invoke;
    local_1a08 = std::
                 _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
                 ::_M_manager;
    puVar5 = (undefined8 *)operator_new(0x10);
    *puVar5 = &PTR_unload_incoming_0014d318;
    puVar5[1] = 0x1000;
    save.super__Function_base._M_functor._8_8_ = local_1a18;
    save.super__Function_base._M_functor._M_unused._M_object = local_19f8;
    save.super__Function_base._M_manager = (_Manager_type)puVar5;
    save._M_invoker._0_4_ = uStack_1b48;
    save._M_invoker._4_4_ = local_1b44;
    load_.super__Function_base._M_functor._8_8_ = world.comm_.data;
    load_.super__Function_base._M_functor._M_unused._M_object = (void *)local_1b40;
    load_.super__Function_base._M_manager._0_4_ = world.rank_;
    load_.super__Function_base._M_manager._4_4_ = world.size_;
    load_._M_invoker = (_Invoker_type)world._16_8_;
    diy::Master::Master(&master,&local_1978,1,-1,(CreateBlock *)local_19b8,
                        (DestroyBlock *)local_19d8,(ExternalStorage *)0x0,save,load_,
                        in_stack_ffffffffffffe4e0);
    std::_Function_base::~_Function_base((_Function_base *)local_1a18);
    std::_Function_base::~_Function_base((_Function_base *)local_19f8);
    std::_Function_base::~_Function_base((_Function_base *)local_19d8);
    std::_Function_base::~_Function_base((_Function_base *)local_19b8);
    diy::mpi::communicator::~communicator(&local_1978);
    local_1798._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    local_1798._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_1798._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
    local_1798._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    local_1798._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_1798._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
    local_1798._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    local_17c8._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    local_17c8._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    local_17c8._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_17c8._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
    local_17c8._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    local_17c8._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_17c8._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
    local_18f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_18f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_18f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1918._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1918._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1918._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    diy::RegularDecomposer<diy::Bounds<int>_>::RegularDecomposer
              (&decomposer,3,&domain,iVar6,(BoolVector *)&local_1798,(BoolVector *)&local_17c8,
               (CoordinateVector *)&local_18f8,(DivisionsVector *)&local_1918);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1918);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_18f8);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_17c8);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_1798);
    dynamic_assigner.super_Assigner.size_ = 0;
    dynamic_assigner.super_Assigner.nblocks_ = 0;
    dynamic_assigner.comm_._8_8_ =
         std::
         _Function_handler<void_(int,_diy::Bounds<int>,_diy::Bounds<int>,_diy::Bounds<int>,_diy::RegularLink<diy::Bounds<int>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/load_balancing/sampling.cpp:81:26)>
         ::_M_invoke;
    dynamic_assigner.comm_.comm_.data =
         (MPI_Comm)
         std::
         _Function_handler<void_(int,_diy::Bounds<int>,_diy::Bounds<int>,_diy::Bounds<int>,_diy::RegularLink<diy::Bounds<int>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/load_balancing/sampling.cpp:81:26)>
         ::_M_manager;
    dynamic_assigner.super_Assigner._vptr_Assigner = (_func_int **)&master;
    diy::RegularDecomposer<diy::Bounds<int>_>::decompose
              (&decomposer,world.rank_,&static_assigner.super_StaticAssigner,
               (Creator *)&dynamic_assigner);
    std::_Function_base::~_Function_base((_Function_base *)&dynamic_assigner);
    if (world.rank_ == 0) {
      fmt::v7::print<char[32],,char>(_stderr,(char (*) [32])"Summary stats before beginning\n");
    }
    summary_stats(&master);
    MPI_Barrier(world.comm_.data);
    wall_time = (double)MPI_Wtime();
    local_1a60 = wall_time;
    dVar7 = (double)MPI_Wtime();
    diy::DynamicAssigner::DynamicAssigner(&dynamic_assigner,&world,world.size_,iVar6);
    diy::record_local_gids(&master,&dynamic_assigner);
    MPI_Barrier(world.comm_.data);
    dVar1 = (double)MPI_Wtime();
    local_1ac0 = 0.0;
    dVar7 = (dVar1 - dVar7) + 0.0;
    balance_time = dVar7;
    MPI_Barrier(world.comm_.data);
    local_1a58._M_dataplus._M_p._0_4_ = 0;
    while( true ) {
      if (iters <= (int)local_1a58._M_dataplus._M_p) break;
      if (world.rank_ == 0) {
        fmt::v7::print<char[14],int&,char>
                  (_stderr,(char (*) [14])"iteration {}\n",(int *)&local_1a58);
      }
      MPI_Barrier(world.comm_.data);
      dVar1 = (double)MPI_Wtime();
      local_1a88._M_unused._M_object = (void *)0x0;
      local_1a88._8_8_ = 0;
      local_1a70 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
                   _M_invoke;
      local_1a78 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
                   _M_manager;
      local_1aa8[0] = (code *)&max_time;
      local_1aa8[1] = (code *)&local_1a58;
      local_1a90 = std::
                   _Function_handler<void_(Block_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/load_balancing/sampling.cpp:138:24)>
                   ::_M_invoke;
      local_1a98 = std::
                   _Function_handler<void_(Block_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/load_balancing/sampling.cpp:138:24)>
                   ::_M_manager;
      diy::Master::foreach_<Block>(&master,(Callback<Block> *)local_1aa8,(Skip *)&local_1a88);
      std::_Function_base::~_Function_base((_Function_base *)local_1aa8);
      std::_Function_base::~_Function_base((_Function_base *)&local_1a88);
      MPI_Barrier(world.comm_.data);
      dVar2 = (double)MPI_Wtime();
      local_1ac0 = local_1ac0 + (dVar2 - dVar1);
      comp_time = local_1ac0;
      dVar1 = (double)MPI_Wtime();
      local_1aa8[0] = get_block_work;
      diy::load_balance_sampling<unsigned_int(*)(Block*,int)>
                (&master,&dynamic_assigner,(_func_uint_Block_ptr_int **)local_1aa8,sample_frac,
                 quantile);
      MPI_Barrier(world.comm_.data);
      dVar2 = (double)MPI_Wtime();
      dVar7 = dVar7 + (dVar2 - dVar1);
      local_1a58._M_dataplus._M_p._0_4_ = (int)local_1a58._M_dataplus._M_p + 1;
      balance_time = dVar7;
    }
    MPI_Barrier(world.comm_.data);
    dVar7 = (double)MPI_Wtime();
    wall_time = dVar7 - local_1a60;
    if (world.rank_ == 0) {
      fmt::v7::print<char[86],double&,double&,double&,char>
                (_stderr,(char (*) [86])
                         "Total elapsed wall time {:.4} s = computation time {:.4} s + balancing time {:.4} s.\n"
                 ,&wall_time,&comp_time,&balance_time);
      if (world.rank_ == 0) {
        fmt::v7::print<char[31],,char>(_stderr,(char (*) [31])"Summary stats upon completion\n");
      }
    }
    summary_stats(&master);
    diy::DynamicAssigner::~DynamicAssigner(&dynamic_assigner);
    diy::RegularDecomposer<diy::Bounds<int>_>::~RegularDecomposer(&decomposer);
    diy::Master::~Master(&master);
    diy::Bounds<int>::~Bounds(&domain);
    iVar6 = 0;
  }
  else if (world.rank_ == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar4 = std::operator<<(poVar4,*argv);
    std::operator<<(poVar4," [OPTIONS]\n");
    std::operator<<((ostream *)&std::cout,"Tests work stealing\n");
    opts::operator<<((ostream *)&std::cout,&ops);
  }
  opts::Options::~Options(&ops);
  diy::mpi::communicator::~communicator(&world);
  diy::mpi::environment::~environment(&env);
  return iVar6;
}

Assistant:

int main(int argc, char* argv[])
{
    diy::mpi::environment     env(argc, argv);                          // diy equivalent of MPI_Init
    diy::mpi::communicator    world;                                    // diy equivalent of MPI communicator
    int                       bpr = 4;                                  // blocks per rank
    int                       iters = 1;                                // number of iterations to run
    int                       max_time = 1;                             // maximum time to compute a block (sec.)
    float                     sample_frac = 0.5f;                       // fraction of world procs to sample (0.0 - 1.0)
    float                     quantile = 0.8f;                          // quantile cutoff above which to move blocks (0.0 - 1.0)
    double                    wall_time;                                // wall clock execution time for entire code
    double                    comp_time = 0.0;                          // total computation time (sec.)
    double                    balance_time = 0.0;                       // total load balancing time (sec.)
    double                    t0;                                       // starting time (sec.)
    bool                      help;

    using namespace opts;
    Options ops;
    ops
        >> Option('h', "help",          help,           "show help")
        >> Option('b', "bpr",           bpr,            "number of diy blocks per mpi rank")
        >> Option('i', "iters",         iters,          "number of iterations")
        >> Option('t', "max_time",      max_time,       "maximum time to compute a block (in seconds)")
        >> Option('s', "sample_frac",   sample_frac,    "fraction of world procs to sample (0.0 - 1.0)")
        >> Option('q', "quantile",      quantile,       "quantile cutoff above which to move blocks (0.0 - 1.0)")
        ;

    if (!ops.parse(argc,argv) || help)
    {
        if (world.rank() == 0)
        {
            std::cout << "Usage: " << argv[0] << " [OPTIONS]\n";
            std::cout << "Tests work stealing\n";
            std::cout << ops;
        }
        return 1;
    }

//     diy::create_logger("trace");

    int                       nblocks = world.size() * bpr;             // total number of blocks in global domain
    diy::ContiguousAssigner   static_assigner(world.size(), nblocks);

    Bounds domain(3);                                                   // global data size
    domain.min[0] = domain.min[1] = domain.min[2] = 0;
    domain.max[0] = domain.max[1] = domain.max[2] = 255;

    // seed random number generator for user code, broadcast seed, offset by rank
    time_t t;
    if (world.rank() == 0)
        t = time(0);
    diy::mpi::broadcast(world, t, 0);
    srand(t + world.rank());

    // create master for managing blocks in this process
    diy::Master master(world,
                       1,                                               // one thread
                       -1,                                              // all blocks in memory
                       &Block::create,
                       &Block::destroy,
                       0,
                       &Block::save,
                       &Block::load);

    // create a regular decomposer and call its decompose function
    diy::RegularDecomposer<Bounds> decomposer(3,
                                              domain,
                                              nblocks);
    decomposer.decompose(world.rank(), static_assigner,
                         [&](int gid,                                   // block global id
                             const Bounds&,                             // core block bounds without any ghost added (unused)
                             const Bounds& bounds,                      // block bounds including ghost region
                             const Bounds&,                             // global domain bounds (unused)
                             const RGLink& link)                        // neighborhood
                         {
                             Block*     b   = new Block;
                             RGLink*    l   = new RGLink(link);
                             b->gid         = gid;

                             b->bounds      = bounds;
                             // TODO: comment out the following line for actual random work
                             // generation, leave uncommented for reproducible work generation
                             std::srand(gid + 1);

                             b->work        = static_cast<diy::Work>(double(std::rand()) / RAND_MAX * WORK_MAX);
                             master.add(gid, b, l);
                         });

    // collect summary stats before beginning
    if (world.rank() == 0)
        fmt::print(stderr, "Summary stats before beginning\n");
    summary_stats(master);

    // timing
    world.barrier();                                                    // barrier to synchronize clocks across procs, do not remove
    wall_time = MPI_Wtime();
    t0 = MPI_Wtime();

    // copy dynamic assigner from master
    diy::DynamicAssigner    dynamic_assigner(world, world.size(), nblocks);
    diy::record_local_gids(master, dynamic_assigner);

    // timing
    world.barrier();
    balance_time += (MPI_Wtime() - t0);

    // this barrier is mandatory, do not remove
    // dynamic assigner needs to be fully updated and sync'ed across all procs before proceeding
    world.barrier();

    // debug: print each block
//     master.foreach([&](Block* b, const diy::Master::ProxyWithLink& cp)
//             { b->show_block(cp); });

    // perform some iterative algorithm
    for (auto n = 0; n < iters; n++)
    {
        // debug
        if (world.rank() == 0)
            fmt::print(stderr, "iteration {}\n", n);

        // timing
        world.barrier();
        t0 = MPI_Wtime();

        // some block computation
        master.foreach([&](Block* b, const diy::Master::ProxyWithLink& cp)
                { b->compute(cp, max_time, n); });

        // timing
        world.barrier();
        comp_time += (MPI_Wtime() - t0);
        t0 = MPI_Wtime();

        // sampling load balancing method
        diy::load_balance_sampling(master, dynamic_assigner, &get_block_work, sample_frac, quantile);

        // timing
        world.barrier();
        balance_time += (MPI_Wtime() - t0);
    }

    // debug: print the master
//     for (auto i = 0; i < master.size(); i++)
//         fmt::print(stderr, "lid {} gid {}\n", i, master.gid(i));

    world.barrier();                                    // barrier to synchronize clocks over procs, do not remove
    wall_time = MPI_Wtime() - wall_time;
    if (world.rank() == 0)
    if (world.rank() == 0)
        fmt::print(stderr, "Total elapsed wall time {:.4} s = computation time {:.4} s + balancing time {:.4} s.\n",
                wall_time, comp_time, balance_time);

    // load balance summary stats
    if (world.rank() == 0)
        fmt::print(stderr, "Summary stats upon completion\n");
    summary_stats(master);
}